

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaWriteVer.c
# Opt level: O1

char * Prs_ManWriteRange(Prs_Ntk_t *p,int RangeId,int fSlice)

{
  Vec_Int_t *pVVar1;
  Vec_Str_t *p_00;
  char *pcVar2;
  uint uVar3;
  uint uVar4;
  
  uVar3 = 0;
  uVar4 = 0;
  if (RangeId != 0) {
    if (RangeId < 0) goto LAB_003f6dee;
    pVVar1 = p->vHash->vObjs;
    if (pVVar1->nSize <= RangeId * 4) goto LAB_003f6dee;
    uVar4 = pVVar1->pArray[(uint)(RangeId * 4)];
  }
  if (RangeId != 0) {
    if (-1 < RangeId) {
      pVVar1 = p->vHash->vObjs;
      if (RangeId * 4 < pVVar1->nSize) {
        uVar3 = pVVar1->pArray[(ulong)(uint)(RangeId * 4) + 1];
        goto LAB_003f6dab;
      }
    }
LAB_003f6dee:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
LAB_003f6dab:
  p_00 = Abc_NamBuffer(p->pStrs);
  if ((fSlice != 0) && (uVar4 == uVar3)) {
    pcVar2 = Vec_StrPrintF(p_00,"[%d]",(ulong)uVar3);
    return pcVar2;
  }
  pcVar2 = Vec_StrPrintF(p_00,"[%d:%d]",(ulong)uVar4,(ulong)uVar3);
  return pcVar2;
}

Assistant:

static inline char * Prs_ManWriteRange( Prs_Ntk_t * p, int RangeId, int fSlice )
{
    int Left  = RangeId ? Hash_IntObjData0( p->vHash, RangeId ) : 0;
    int Right = RangeId ? Hash_IntObjData1( p->vHash, RangeId ) : 0;
    if ( Left == Right && fSlice )
        return Vec_StrPrintF( Abc_NamBuffer(p->pStrs), "[%d]", Right );
    else
        return Vec_StrPrintF( Abc_NamBuffer(p->pStrs), "[%d:%d]", Left, Right );
}